

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgParser.cpp
# Opt level: O2

void __thiscall ArgParser::ArgParser(ArgParser *this,int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  double dVar5;
  
  (this->input_file)._M_dataplus._M_p = (pointer)&(this->input_file).field_2;
  (this->input_file)._M_string_length = 0;
  (this->input_file).field_2._M_local_buf[0] = '\0';
  (this->output_file)._M_dataplus._M_p = (pointer)&(this->output_file).field_2;
  (this->output_file)._M_string_length = 0;
  (this->output_file).field_2._M_local_buf[0] = '\0';
  (this->log_file)._M_dataplus._M_p = (pointer)&(this->log_file).field_2;
  (this->log_file)._M_string_length = 0;
  (this->log_file).field_2._M_local_buf[0] = '\0';
  defaultValues(this);
  uVar4 = 1;
  do {
    if (argc <= (int)uVar4) {
      std::operator<<((ostream *)&std::cout,"Args:\n");
      poVar3 = std::operator<<((ostream *)&std::cout,"- input: ");
      poVar3 = std::operator<<(poVar3,(string *)this);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"- output: ");
      poVar3 = std::operator<<(poVar3,(string *)&this->output_file);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"- width: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->width);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"- height: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->height);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"- iters: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->iters);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"- length: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->length);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"- log: ");
      poVar3 = std::operator<<(poVar3,(string *)&this->log_file);
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    __s1 = argv[(int)uVar4];
    iVar1 = strcmp(__s1,"-input");
    if (iVar1 == 0) {
      iVar1 = uVar4 + 1;
      if (argc <= iVar1) {
        uVar4 = 0x10;
        goto LAB_0011bd9f;
      }
      std::__cxx11::string::assign((char *)this);
    }
    else {
      iVar1 = strcmp(__s1,"-output");
      if (iVar1 == 0) {
        iVar1 = uVar4 + 1;
        if (argc <= iVar1) {
          uVar4 = 0x14;
          goto LAB_0011bd9f;
        }
        std::__cxx11::string::assign((char *)&this->output_file);
      }
      else {
        iVar1 = strcmp(__s1,"-size");
        if (iVar1 == 0) {
          if (argc <= (int)(uVar4 + 1)) {
            uVar4 = 0x18;
LAB_0011bd9f:
            __assert_fail("i < argc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                          ,uVar4,"ArgParser::ArgParser(int, const char **)");
          }
          iVar1 = atoi(argv[(int)(uVar4 + 1)]);
          this->width = iVar1;
          iVar1 = uVar4 + 2;
          if (argc <= iVar1) {
            uVar4 = 0x1b;
            goto LAB_0011bd9f;
          }
          iVar2 = atoi(argv[iVar1]);
          this->height = iVar2;
        }
        else {
          iVar1 = strcmp(__s1,"-iters");
          if (iVar1 == 0) {
            iVar1 = uVar4 + 1;
            if (argc <= iVar1) {
              uVar4 = 0x22;
              goto LAB_0011bd9f;
            }
            iVar2 = atoi(argv[iVar1]);
            this->iters = iVar2;
          }
          else {
            iVar1 = strcmp(__s1,"-length");
            if (iVar1 == 0) {
              iVar1 = uVar4 + 1;
              if (argc <= iVar1) {
                uVar4 = 0x26;
                goto LAB_0011bd9f;
              }
              dVar5 = atof(argv[iVar1]);
              this->length = (float)dVar5;
            }
            else {
              iVar1 = strcmp(__s1,"-log");
              if (iVar1 != 0) {
                printf("Unknown command line argument %d: \'%s\'\n",(ulong)uVar4,__s1);
                exit(1);
              }
              iVar1 = uVar4 + 1;
              if (argc <= iVar1) {
                uVar4 = 0x2d;
                goto LAB_0011bd9f;
              }
              std::__cxx11::string::assign((char *)&this->log_file);
            }
          }
        }
      }
    }
    uVar4 = iVar1 + 1;
  } while( true );
}

Assistant:

ArgParser::ArgParser(int argc, const char *argv[]) {
    defaultValues();

    for (int i = 1; i < argc; i++) {
        // rendering output
        if (!strcmp(argv[i], "-input")) {
            i++;
            assert (i < argc);
            input_file = argv[i];
        } else if (!strcmp(argv[i], "-output")) {
            i++;
            assert (i < argc);
            output_file = argv[i];
        } else if (!strcmp(argv[i], "-size")) {
            i++;
            assert (i < argc);
            width = atoi(argv[i]);
            i++;
            assert (i < argc);
            height = atoi(argv[i]);
        }

        // rendering options
        else if (!strcmp(argv[i], "-iters")) {
            i++;
            assert (i < argc);
            iters = atoi(argv[i]);
        } else if (!strcmp(argv[i], "-length")) {
            i++;
            assert (i < argc);
            length = atof(argv[i]);
        }

        // logging
        else if (!strcmp(argv[i], "-log")) {
            i++;
            assert (i < argc);
            log_file = argv[i];
        }

        // Unknown argument.
        else {
            printf("Unknown command line argument %d: '%s'\n", i, argv[i]);
            exit(1);
        }
    }

    std::cout << "Args:\n";
    std::cout << "- input: " << input_file << std::endl;
    std::cout << "- output: " << output_file << std::endl;
    std::cout << "- width: " << width << std::endl;
    std::cout << "- height: " << height << std::endl;
    std::cout << "- iters: " << iters << std::endl;
    std::cout << "- length: " << length << std::endl;
    std::cout << "- log: " << log_file << std::endl;
}